

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O3

void * __thiscall
CNetObjHandler::SecureUnpackMsg(CNetObjHandler *this,int Type,CUnpacker *pUnpacker)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  this->m_pMsgFailedOn = (char *)0x0;
  this->m_pObjFailedOn = (char *)0x0;
  switch(Type) {
  case 1:
  case 2:
    iVar1 = 1;
    goto LAB_0013f9ee;
  case 3:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x10) = pcVar3;
    if (*(uint *)this->m_aMsgData < 4) {
      if (0x40 < *(int *)(this->m_aMsgData + 4) + 1U) goto LAB_00140590;
      if (*(int *)(this->m_aMsgData + 8) + 1U < 0x41) goto switchD_0013f9d9_caseD_6;
      pcVar3 = "m_TargetID";
    }
    else {
LAB_001404e1:
      pcVar3 = "m_Mode";
    }
    break;
  case 4:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0xc) = iVar1;
    if (*(int *)this->m_aMsgData + 1U < 0x41) {
      if (*(int *)(this->m_aMsgData + 4) + 1U < 3) {
        if (1 < *(uint *)(this->m_aMsgData + 8)) goto LAB_00140288;
        if (-1 < iVar1) goto switchD_0013f9d9_caseD_6;
        pcVar3 = "m_CooldownTick";
        break;
      }
      goto LAB_00140526;
    }
    goto LAB_00140590;
  case 5:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0xc) = iVar1;
    if (*(int *)this->m_aMsgData + 2U < 0x42) {
      if (*(uint *)(this->m_aMsgData + 4) < 0x40) {
        if (*(int *)(this->m_aMsgData + 8) + 3U < 9) goto switchD_0013f9d9_caseD_6;
        goto LAB_0013fda1;
      }
      pcVar3 = "m_Victim";
    }
    else {
      pcVar3 = "m_Killer";
    }
    break;
  case 6:
  case 7:
  case 8:
  case 0xb:
  case 0xc:
  case 0x15:
  case 0x1c:
  case 0x1d:
    goto switchD_0013f9d9_caseD_6;
  case 9:
    uVar2 = CUnpacker::GetInt(pUnpacker);
    *(uint *)this->m_aMsgData = uVar2;
    if (uVar2 < 6) goto switchD_0013f9d9_caseD_6;
LAB_0013fda1:
    pcVar3 = "m_Weapon";
    break;
  case 10:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    uVar2 = CUnpacker::GetInt(pUnpacker);
    *(uint *)(this->m_aMsgData + 4) = uVar2;
    if (*(uint *)this->m_aMsgData < 0x40) goto LAB_001401da;
    goto LAB_00140590;
  case 0xd:
  case 0xe:
  case 0x26:
    iVar1 = 6;
LAB_0013f9ee:
    pcVar3 = CUnpacker::GetString(pUnpacker,iVar1);
    *(char **)this->m_aMsgData = pcVar3;
    goto switchD_0013f9d9_caseD_6;
  case 0xf:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x10) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x18) = pcVar3;
    if (0x40 < *(int *)this->m_aMsgData + 1U) goto LAB_00140590;
    if (*(uint *)(this->m_aMsgData + 4) < 7) {
      if (*(uint *)(this->m_aMsgData + 8) < 0x3d) goto switchD_0013f9d9_caseD_6;
      pcVar3 = "m_Timeout";
    }
    else {
      pcVar3 = "m_Type";
    }
    break;
  case 0x10:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    uVar2 = CUnpacker::GetInt(pUnpacker);
    *(uint *)(this->m_aMsgData + 0xc) = uVar2;
    if (*(uint *)this->m_aMsgData < 0x41) {
      if (*(uint *)(this->m_aMsgData + 4) < 0x41) {
        if (*(uint *)(this->m_aMsgData + 8) < 0x41) {
          if (uVar2 < 0x41) goto switchD_0013f9d9_caseD_6;
          pcVar3 = "m_Total";
        }
        else {
          pcVar3 = "m_Pass";
        }
      }
      else {
        pcVar3 = "m_No";
      }
    }
    else {
      pcVar3 = "m_Yes";
    }
    break;
  case 0x11:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0xc) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x10) = iVar1;
    uVar2 = CUnpacker::GetInt(pUnpacker);
    *(uint *)(this->m_aMsgData + 0x14) = uVar2;
    if (*(uint *)this->m_aMsgData < 2) {
      if (*(uint *)(this->m_aMsgData + 4) < 0x41) {
        if (*(uint *)(this->m_aMsgData + 8) < 2) {
          if (*(uint *)(this->m_aMsgData + 0xc) < 2) {
            if (*(uint *)(this->m_aMsgData + 0x10) < 2) {
              if (uVar2 < 0x41) goto switchD_0013f9d9_caseD_6;
              pcVar3 = "m_PlayerSlots";
            }
            else {
              pcVar3 = "m_TeamBalance";
            }
          }
          else {
            pcVar3 = "m_TeamLock";
          }
        }
        else {
          pcVar3 = "m_SpecVote";
        }
      }
      else {
        pcVar3 = "m_KickMin";
      }
    }
    else {
      pcVar3 = "m_KickVote";
    }
    break;
  case 0x12:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x10) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x18) = pcVar3;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x20) = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x28) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x30) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x38) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x40) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x48) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x50) = pcVar3;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x58) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x5c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x60) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 100) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x68) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x6c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x70) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x74) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x78) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x7c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x80) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x84) = iVar1;
    uVar2 = CUnpacker::GetInt(pUnpacker);
    *(uint *)(this->m_aMsgData + 0x88) = uVar2;
    if (0x3f < *(uint *)this->m_aMsgData) goto LAB_00140590;
    if (*(uint *)(this->m_aMsgData + 4) < 2) {
      if (2 < *(int *)(this->m_aMsgData + 8) + 1U) goto LAB_00140526;
      if (*(uint *)(this->m_aMsgData + 0x58) < 2) {
        if (*(uint *)(this->m_aMsgData + 0x5c) < 2) {
          if (*(uint *)(this->m_aMsgData + 0x60) < 2) {
            if (1 < *(uint *)(this->m_aMsgData + 100)) goto LAB_001406c1;
            if (1 < *(uint *)(this->m_aMsgData + 0x68)) goto LAB_001406fd;
            if (*(uint *)(this->m_aMsgData + 0x6c) < 2) goto LAB_0014027f;
            goto LAB_00140482;
          }
          goto LAB_00140661;
        }
        goto LAB_00140619;
      }
      goto LAB_0014048e;
    }
    pcVar3 = "m_Local";
    break;
  case 0x13:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0xc) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x10) = iVar1;
    if (*(uint *)this->m_aMsgData < 0x10) {
      if (*(int *)(this->m_aMsgData + 4) < 0) {
        pcVar3 = "m_ScoreLimit";
      }
      else if (*(int *)(this->m_aMsgData + 8) < 0) {
        pcVar3 = "m_TimeLimit";
      }
      else if (*(int *)(this->m_aMsgData + 0xc) < 0) {
        pcVar3 = "m_MatchNum";
      }
      else {
        if (-1 < iVar1) goto switchD_0013f9d9_caseD_6;
        pcVar3 = "m_MatchCurrent";
      }
    }
    else {
      pcVar3 = "m_GameFlags";
    }
    break;
  case 0x14:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 8) = pcVar3;
    uVar2 = CUnpacker::GetInt(pUnpacker);
    *(uint *)(this->m_aMsgData + 0x10) = uVar2;
    if (0x3f < *(uint *)this->m_aMsgData) goto LAB_00140590;
LAB_0014027f:
    if (uVar2 < 2) goto switchD_0013f9d9_caseD_6;
LAB_00140288:
    pcVar3 = "m_Silent";
    break;
  case 0x16:
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)this->m_aMsgData = pcVar3;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0xc) = iVar1;
    if (*(int *)(this->m_aMsgData + 8) + 1U < 0x41) goto LAB_0014051f;
    goto LAB_00140590;
  case 0x17:
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)this->m_aMsgData = pcVar3;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x10) = pcVar3;
    if (*(int *)(this->m_aMsgData + 8) + 1U < 0x41) goto switchD_0013f9d9_caseD_6;
    goto LAB_00140590;
  case 0x18:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 8) = pcVar3;
    if (3 < *(uint *)this->m_aMsgData) goto LAB_001404e1;
    if (*(int *)(this->m_aMsgData + 4) + 1U < 0x41) goto switchD_0013f9d9_caseD_6;
    pcVar3 = "m_Target";
    break;
  case 0x19:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
LAB_0014051f:
    if (iVar1 + 1U < 3) goto switchD_0013f9d9_caseD_6;
LAB_00140526:
    pcVar3 = "m_Team";
    break;
  case 0x1a:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    if (*(uint *)this->m_aMsgData < 4) {
      if (iVar1 + 1U < 0x41) goto switchD_0013f9d9_caseD_6;
      pcVar3 = "m_SpectatorID";
    }
    else {
      pcVar3 = "m_SpecMode";
    }
    break;
  case 0x1b:
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)this->m_aMsgData = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 8) = pcVar3;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x10) = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x18) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x20) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x28) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x30) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x38) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x40) = pcVar3;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x48) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x4c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x50) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x54) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x58) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x5c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x60) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 100) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x68) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x6c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x70) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x74) = iVar1;
    if (*(uint *)(this->m_aMsgData + 0x48) < 2) {
      if (*(uint *)(this->m_aMsgData + 0x4c) < 2) {
        if (*(uint *)(this->m_aMsgData + 0x50) < 2) {
          if (*(uint *)(this->m_aMsgData + 0x54) < 2) {
            if (1 < *(uint *)(this->m_aMsgData + 0x58)) goto LAB_001406fd;
            uVar2 = *(uint *)(this->m_aMsgData + 0x5c);
joined_r0x0013fb64:
            if (uVar2 < 2) goto switchD_0013f9d9_caseD_6;
LAB_00140482:
            pcVar3 = "m_aUseCustomColors[5]";
          }
          else {
LAB_001406c1:
            pcVar3 = "m_aUseCustomColors[3]";
          }
        }
        else {
LAB_00140661:
          pcVar3 = "m_aUseCustomColors[2]";
        }
      }
      else {
LAB_00140619:
        pcVar3 = "m_aUseCustomColors[1]";
      }
    }
    else {
LAB_0014048e:
      pcVar3 = "m_aUseCustomColors[0]";
    }
    break;
  case 0x1e:
    uVar2 = CUnpacker::GetInt(pUnpacker);
    *(uint *)this->m_aMsgData = uVar2;
LAB_001401da:
    if (uVar2 < 0x10) goto switchD_0013f9d9_caseD_6;
    pcVar3 = "m_Emoticon";
    break;
  case 0x1f:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    if (iVar1 + 1U < 3) goto switchD_0013f9d9_caseD_6;
    pcVar3 = "m_Vote";
    break;
  case 0x20:
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)this->m_aMsgData = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 8) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x10) = pcVar3;
    uVar2 = CUnpacker::GetInt(pUnpacker);
    *(uint *)(this->m_aMsgData + 0x18) = uVar2;
    if (uVar2 < 2) goto switchD_0013f9d9_caseD_6;
    pcVar3 = "m_Force";
    break;
  case 0x21:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 8) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x10) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x18) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x20) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x28) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x30) = pcVar3;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x38) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x3c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x40) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x44) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x48) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x4c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x50) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x54) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x58) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x5c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x60) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 100) = iVar1;
    if (*(uint *)this->m_aMsgData < 0x40) {
      if (*(uint *)(this->m_aMsgData + 0x38) < 2) {
        if (*(uint *)(this->m_aMsgData + 0x3c) < 2) {
          if (*(uint *)(this->m_aMsgData + 0x40) < 2) {
            if (1 < *(uint *)(this->m_aMsgData + 0x44)) goto LAB_001406c1;
            if (*(uint *)(this->m_aMsgData + 0x48) < 2) {
              uVar2 = *(uint *)(this->m_aMsgData + 0x4c);
              goto joined_r0x0013fb64;
            }
            goto LAB_001406fd;
          }
          goto LAB_00140661;
        }
        goto LAB_00140619;
      }
      goto LAB_0014048e;
    }
LAB_00140590:
    pcVar3 = "m_ClientID";
    break;
  case 0x22:
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)this->m_aMsgData = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 8) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x10) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x18) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x20) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x28) = pcVar3;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x30) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x34) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x38) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x3c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x40) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x44) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x48) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x4c) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x50) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x54) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x58) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0x5c) = iVar1;
    if (1 < *(uint *)(this->m_aMsgData + 0x30)) goto LAB_0014048e;
    if (1 < *(uint *)(this->m_aMsgData + 0x34)) goto LAB_00140619;
    if (1 < *(uint *)(this->m_aMsgData + 0x38)) goto LAB_00140661;
    if (1 < *(uint *)(this->m_aMsgData + 0x3c)) goto LAB_001406c1;
    if (*(uint *)(this->m_aMsgData + 0x40) < 2) {
      uVar2 = *(uint *)(this->m_aMsgData + 0x44);
      goto joined_r0x0013fb64;
    }
LAB_001406fd:
    pcVar3 = "m_aUseCustomColors[4]";
    break;
  case 0x23:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 4) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 8) = iVar1;
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)(this->m_aMsgData + 0xc) = iVar1;
    uVar2 = CUnpacker::GetIntOrDefault(pUnpacker,0);
    *(uint *)(this->m_aMsgData + 0x10) = uVar2;
    if (0x3f < *(uint *)this->m_aMsgData) goto LAB_00140590;
    if (*(int *)(this->m_aMsgData + 4) < -1) {
      pcVar3 = "m_Time";
    }
    else if (*(uint *)(this->m_aMsgData + 0xc) < 2) {
      if (uVar2 < 2) goto switchD_0013f9d9_caseD_6;
      pcVar3 = "m_RecordServer";
    }
    else {
      pcVar3 = "m_RecordPersonal";
    }
    break;
  case 0x24:
    iVar1 = CUnpacker::GetInt(pUnpacker);
    *(int *)this->m_aMsgData = iVar1;
    goto switchD_0013f9d9_caseD_6;
  case 0x25:
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)this->m_aMsgData = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 8) = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 0x10) = pcVar3;
    goto switchD_0013f9d9_caseD_6;
  case 0x27:
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)this->m_aMsgData = pcVar3;
    pcVar3 = CUnpacker::GetString(pUnpacker,6);
    *(char **)(this->m_aMsgData + 8) = pcVar3;
    goto switchD_0013f9d9_caseD_6;
  default:
    this->m_pMsgFailedOn = "(type out of range)";
    goto switchD_0013f9d9_caseD_6;
  }
  this->m_pObjFailedOn = pcVar3;
  this->m_NumObjFailures = this->m_NumObjFailures + 1;
switchD_0013f9d9_caseD_6:
  if (pUnpacker->m_Error == 0) {
    pcVar3 = this->m_pObjFailedOn;
    if (this->m_pMsgFailedOn == (char *)0x0 && pcVar3 == (char *)0x0) {
      this->m_pMsgFailedOn = "";
      this->m_pObjFailedOn = "";
      return this->m_aMsgData;
    }
    if (this->m_pMsgFailedOn == (char *)0x0) {
      this->m_pMsgFailedOn = "";
    }
  }
  else {
    this->m_pMsgFailedOn = "(unpack error)";
    pcVar3 = this->m_pObjFailedOn;
  }
  if (pcVar3 == (char *)0x0) {
    this->m_pObjFailedOn = "";
  }
  return (void *)0x0;
}

Assistant:

void *CNetObjHandler::SecureUnpackMsg(int Type, CUnpacker *pUnpacker)
{
	m_pMsgFailedOn = 0;
	m_pObjFailedOn = 0;
	switch(Type)
	{
	case NETMSGTYPE_SV_MOTD:
	{
		CNetMsg_Sv_Motd *pMsg = (CNetMsg_Sv_Motd *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pMessage = pUnpacker->GetString();
	} break;
	
	case NETMSGTYPE_SV_BROADCAST:
	{
		CNetMsg_Sv_Broadcast *pMsg = (CNetMsg_Sv_Broadcast *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pMessage = pUnpacker->GetString();
	} break;
	
	case NETMSGTYPE_SV_CHAT:
	{
		CNetMsg_Sv_Chat *pMsg = (CNetMsg_Sv_Chat *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Mode = pUnpacker->GetInt();
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_TargetID = pUnpacker->GetInt();
		pMsg->m_pMessage = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		if(!CheckInt("m_Mode", pMsg->m_Mode, 0, NUM_CHATS-1)) break;
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_TargetID", pMsg->m_TargetID, -1, MAX_CLIENTS-1)) break;
	} break;
	
	case NETMSGTYPE_SV_TEAM:
	{
		CNetMsg_Sv_Team *pMsg = (CNetMsg_Sv_Team *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Team = pUnpacker->GetInt();
		pMsg->m_Silent = pUnpacker->GetInt();
		pMsg->m_CooldownTick = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Team", pMsg->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) break;
		if(!CheckInt("m_Silent", pMsg->m_Silent, 0, 1)) break;
		if(!CheckInt("m_CooldownTick", pMsg->m_CooldownTick, 0, max_int)) break;
	} break;
	
	case NETMSGTYPE_SV_KILLMSG:
	{
		CNetMsg_Sv_KillMsg *pMsg = (CNetMsg_Sv_KillMsg *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Killer = pUnpacker->GetInt();
		pMsg->m_Victim = pUnpacker->GetInt();
		pMsg->m_Weapon = pUnpacker->GetInt();
		pMsg->m_ModeSpecial = pUnpacker->GetInt();
		if(!CheckInt("m_Killer", pMsg->m_Killer, -2, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Victim", pMsg->m_Victim, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Weapon", pMsg->m_Weapon, -3, NUM_WEAPONS-1)) break;
	} break;
	
	case NETMSGTYPE_SV_TUNEPARAMS:
	{
		CNetMsg_Sv_TuneParams *pMsg = (CNetMsg_Sv_TuneParams *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_EXTRAPROJECTILE:
	{
		CNetMsg_Sv_ExtraProjectile *pMsg = (CNetMsg_Sv_ExtraProjectile *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_READYTOENTER:
	{
		CNetMsg_Sv_ReadyToEnter *pMsg = (CNetMsg_Sv_ReadyToEnter *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_WEAPONPICKUP:
	{
		CNetMsg_Sv_WeaponPickup *pMsg = (CNetMsg_Sv_WeaponPickup *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Weapon = pUnpacker->GetInt();
		if(!CheckInt("m_Weapon", pMsg->m_Weapon, 0, NUM_WEAPONS-1)) break;
	} break;
	
	case NETMSGTYPE_SV_EMOTICON:
	{
		CNetMsg_Sv_Emoticon *pMsg = (CNetMsg_Sv_Emoticon *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Emoticon = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Emoticon", pMsg->m_Emoticon, 0, 15)) break;
	} break;
	
	case NETMSGTYPE_SV_VOTECLEAROPTIONS:
	{
		CNetMsg_Sv_VoteClearOptions *pMsg = (CNetMsg_Sv_VoteClearOptions *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_VOTEOPTIONLISTADD:
	{
		CNetMsg_Sv_VoteOptionListAdd *pMsg = (CNetMsg_Sv_VoteOptionListAdd *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_VOTEOPTIONADD:
	{
		CNetMsg_Sv_VoteOptionAdd *pMsg = (CNetMsg_Sv_VoteOptionAdd *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	case NETMSGTYPE_SV_VOTEOPTIONREMOVE:
	{
		CNetMsg_Sv_VoteOptionRemove *pMsg = (CNetMsg_Sv_VoteOptionRemove *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	case NETMSGTYPE_SV_VOTESET:
	{
		CNetMsg_Sv_VoteSet *pMsg = (CNetMsg_Sv_VoteSet *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Type = pUnpacker->GetInt();
		pMsg->m_Timeout = pUnpacker->GetInt();
		pMsg->m_pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_pReason = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Type", pMsg->m_Type, 0, 6)) break;
		if(!CheckInt("m_Timeout", pMsg->m_Timeout, 0, 60)) break;
	} break;
	
	case NETMSGTYPE_SV_VOTESTATUS:
	{
		CNetMsg_Sv_VoteStatus *pMsg = (CNetMsg_Sv_VoteStatus *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Yes = pUnpacker->GetInt();
		pMsg->m_No = pUnpacker->GetInt();
		pMsg->m_Pass = pUnpacker->GetInt();
		pMsg->m_Total = pUnpacker->GetInt();
		if(!CheckInt("m_Yes", pMsg->m_Yes, 0, MAX_CLIENTS)) break;
		if(!CheckInt("m_No", pMsg->m_No, 0, MAX_CLIENTS)) break;
		if(!CheckInt("m_Pass", pMsg->m_Pass, 0, MAX_CLIENTS)) break;
		if(!CheckInt("m_Total", pMsg->m_Total, 0, MAX_CLIENTS)) break;
	} break;
	
	case NETMSGTYPE_SV_SERVERSETTINGS:
	{
		CNetMsg_Sv_ServerSettings *pMsg = (CNetMsg_Sv_ServerSettings *)m_aMsgData;
		(void)pMsg;
		pMsg->m_KickVote = pUnpacker->GetInt();
		pMsg->m_KickMin = pUnpacker->GetInt();
		pMsg->m_SpecVote = pUnpacker->GetInt();
		pMsg->m_TeamLock = pUnpacker->GetInt();
		pMsg->m_TeamBalance = pUnpacker->GetInt();
		pMsg->m_PlayerSlots = pUnpacker->GetInt();
		if(!CheckInt("m_KickVote", pMsg->m_KickVote, 0, 1)) break;
		if(!CheckInt("m_KickMin", pMsg->m_KickMin, 0, MAX_CLIENTS)) break;
		if(!CheckInt("m_SpecVote", pMsg->m_SpecVote, 0, 1)) break;
		if(!CheckInt("m_TeamLock", pMsg->m_TeamLock, 0, 1)) break;
		if(!CheckInt("m_TeamBalance", pMsg->m_TeamBalance, 0, 1)) break;
		if(!CheckInt("m_PlayerSlots", pMsg->m_PlayerSlots, 0, MAX_CLIENTS)) break;
	} break;
	
	case NETMSGTYPE_SV_CLIENTINFO:
	{
		CNetMsg_Sv_ClientInfo *pMsg = (CNetMsg_Sv_ClientInfo *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Local = pUnpacker->GetInt();
		pMsg->m_Team = pUnpacker->GetInt();
		pMsg->m_pName = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_pClan = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Country = pUnpacker->GetInt();
		pMsg->m_apSkinPartNames[0] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[1] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[2] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[3] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[4] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[5] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_aUseCustomColors[0] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[1] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[2] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[3] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[4] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[5] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[0] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[1] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[2] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[3] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[4] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[5] = pUnpacker->GetInt();
		pMsg->m_Silent = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Local", pMsg->m_Local, 0, 1)) break;
		if(!CheckInt("m_Team", pMsg->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) break;
		if(!CheckInt("m_aUseCustomColors[0]", pMsg->m_aUseCustomColors[0], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[1]", pMsg->m_aUseCustomColors[1], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[2]", pMsg->m_aUseCustomColors[2], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[3]", pMsg->m_aUseCustomColors[3], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[4]", pMsg->m_aUseCustomColors[4], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[5]", pMsg->m_aUseCustomColors[5], 0, 1)) break;
		if(!CheckInt("m_Silent", pMsg->m_Silent, 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_GAMEINFO:
	{
		CNetMsg_Sv_GameInfo *pMsg = (CNetMsg_Sv_GameInfo *)m_aMsgData;
		(void)pMsg;
		pMsg->m_GameFlags = pUnpacker->GetInt();
		pMsg->m_ScoreLimit = pUnpacker->GetInt();
		pMsg->m_TimeLimit = pUnpacker->GetInt();
		pMsg->m_MatchNum = pUnpacker->GetInt();
		pMsg->m_MatchCurrent = pUnpacker->GetInt();
		if(!CheckFlag("m_GameFlags", pMsg->m_GameFlags, GAMEFLAG_TEAMS|GAMEFLAG_FLAGS|GAMEFLAG_SURVIVAL|GAMEFLAG_RACE)) break;
		if(!CheckInt("m_ScoreLimit", pMsg->m_ScoreLimit, 0, max_int)) break;
		if(!CheckInt("m_TimeLimit", pMsg->m_TimeLimit, 0, max_int)) break;
		if(!CheckInt("m_MatchNum", pMsg->m_MatchNum, 0, max_int)) break;
		if(!CheckInt("m_MatchCurrent", pMsg->m_MatchCurrent, 0, max_int)) break;
	} break;
	
	case NETMSGTYPE_SV_CLIENTDROP:
	{
		CNetMsg_Sv_ClientDrop *pMsg = (CNetMsg_Sv_ClientDrop *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_pReason = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Silent = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Silent", pMsg->m_Silent, 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_GAMEMSG:
	{
		CNetMsg_Sv_GameMsg *pMsg = (CNetMsg_Sv_GameMsg *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_DE_CLIENTENTER:
	{
		CNetMsg_De_ClientEnter *pMsg = (CNetMsg_De_ClientEnter *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pName = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Team = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Team", pMsg->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) break;
	} break;
	
	case NETMSGTYPE_DE_CLIENTLEAVE:
	{
		CNetMsg_De_ClientLeave *pMsg = (CNetMsg_De_ClientLeave *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pName = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_pReason = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
	} break;
	
	case NETMSGTYPE_CL_SAY:
	{
		CNetMsg_Cl_Say *pMsg = (CNetMsg_Cl_Say *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Mode = pUnpacker->GetInt();
		pMsg->m_Target = pUnpacker->GetInt();
		pMsg->m_pMessage = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		if(!CheckInt("m_Mode", pMsg->m_Mode, 0, NUM_CHATS-1)) break;
		if(!CheckInt("m_Target", pMsg->m_Target, -1, MAX_CLIENTS-1)) break;
	} break;
	
	case NETMSGTYPE_CL_SETTEAM:
	{
		CNetMsg_Cl_SetTeam *pMsg = (CNetMsg_Cl_SetTeam *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Team = pUnpacker->GetInt();
		if(!CheckInt("m_Team", pMsg->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) break;
	} break;
	
	case NETMSGTYPE_CL_SETSPECTATORMODE:
	{
		CNetMsg_Cl_SetSpectatorMode *pMsg = (CNetMsg_Cl_SetSpectatorMode *)m_aMsgData;
		(void)pMsg;
		pMsg->m_SpecMode = pUnpacker->GetInt();
		pMsg->m_SpectatorID = pUnpacker->GetInt();
		if(!CheckInt("m_SpecMode", pMsg->m_SpecMode, 0, NUM_SPECMODES-1)) break;
		if(!CheckInt("m_SpectatorID", pMsg->m_SpectatorID, -1, MAX_CLIENTS-1)) break;
	} break;
	
	case NETMSGTYPE_CL_STARTINFO:
	{
		CNetMsg_Cl_StartInfo *pMsg = (CNetMsg_Cl_StartInfo *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pName = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_pClan = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Country = pUnpacker->GetInt();
		pMsg->m_apSkinPartNames[0] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[1] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[2] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[3] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[4] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[5] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_aUseCustomColors[0] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[1] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[2] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[3] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[4] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[5] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[0] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[1] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[2] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[3] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[4] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[5] = pUnpacker->GetInt();
		if(!CheckInt("m_aUseCustomColors[0]", pMsg->m_aUseCustomColors[0], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[1]", pMsg->m_aUseCustomColors[1], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[2]", pMsg->m_aUseCustomColors[2], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[3]", pMsg->m_aUseCustomColors[3], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[4]", pMsg->m_aUseCustomColors[4], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[5]", pMsg->m_aUseCustomColors[5], 0, 1)) break;
	} break;
	
	case NETMSGTYPE_CL_KILL:
	{
		CNetMsg_Cl_Kill *pMsg = (CNetMsg_Cl_Kill *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_CL_READYCHANGE:
	{
		CNetMsg_Cl_ReadyChange *pMsg = (CNetMsg_Cl_ReadyChange *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_CL_EMOTICON:
	{
		CNetMsg_Cl_Emoticon *pMsg = (CNetMsg_Cl_Emoticon *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Emoticon = pUnpacker->GetInt();
		if(!CheckInt("m_Emoticon", pMsg->m_Emoticon, 0, 15)) break;
	} break;
	
	case NETMSGTYPE_CL_VOTE:
	{
		CNetMsg_Cl_Vote *pMsg = (CNetMsg_Cl_Vote *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Vote = pUnpacker->GetInt();
		if(!CheckInt("m_Vote", pMsg->m_Vote, VOTE_CHOICE_NO, VOTE_CHOICE_YES)) break;
	} break;
	
	case NETMSGTYPE_CL_CALLVOTE:
	{
		CNetMsg_Cl_CallVote *pMsg = (CNetMsg_Cl_CallVote *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Type = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Value = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Reason = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Force = pUnpacker->GetInt();
		if(!CheckInt("m_Force", pMsg->m_Force, 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_SKINCHANGE:
	{
		CNetMsg_Sv_SkinChange *pMsg = (CNetMsg_Sv_SkinChange *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_apSkinPartNames[0] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[1] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[2] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[3] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[4] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[5] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_aUseCustomColors[0] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[1] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[2] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[3] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[4] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[5] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[0] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[1] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[2] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[3] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[4] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[5] = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_aUseCustomColors[0]", pMsg->m_aUseCustomColors[0], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[1]", pMsg->m_aUseCustomColors[1], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[2]", pMsg->m_aUseCustomColors[2], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[3]", pMsg->m_aUseCustomColors[3], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[4]", pMsg->m_aUseCustomColors[4], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[5]", pMsg->m_aUseCustomColors[5], 0, 1)) break;
	} break;
	
	case NETMSGTYPE_CL_SKINCHANGE:
	{
		CNetMsg_Cl_SkinChange *pMsg = (CNetMsg_Cl_SkinChange *)m_aMsgData;
		(void)pMsg;
		pMsg->m_apSkinPartNames[0] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[1] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[2] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[3] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[4] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[5] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_aUseCustomColors[0] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[1] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[2] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[3] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[4] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[5] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[0] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[1] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[2] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[3] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[4] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[5] = pUnpacker->GetInt();
		if(!CheckInt("m_aUseCustomColors[0]", pMsg->m_aUseCustomColors[0], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[1]", pMsg->m_aUseCustomColors[1], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[2]", pMsg->m_aUseCustomColors[2], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[3]", pMsg->m_aUseCustomColors[3], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[4]", pMsg->m_aUseCustomColors[4], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[5]", pMsg->m_aUseCustomColors[5], 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_RACEFINISH:
	{
		CNetMsg_Sv_RaceFinish *pMsg = (CNetMsg_Sv_RaceFinish *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Time = pUnpacker->GetInt();
		pMsg->m_Diff = pUnpacker->GetInt();
		pMsg->m_RecordPersonal = pUnpacker->GetInt();
		pMsg->m_RecordServer = pUnpacker->GetIntOrDefault(0);
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Time", pMsg->m_Time, -1, max_int)) break;
		if(!CheckInt("m_RecordPersonal", pMsg->m_RecordPersonal, 0, 1)) break;
		if(!CheckInt("m_RecordServer", pMsg->m_RecordServer, 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_CHECKPOINT:
	{
		CNetMsg_Sv_Checkpoint *pMsg = (CNetMsg_Sv_Checkpoint *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Diff = pUnpacker->GetInt();
	} break;
	
	case NETMSGTYPE_SV_COMMANDINFO:
	{
		CNetMsg_Sv_CommandInfo *pMsg = (CNetMsg_Sv_CommandInfo *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Name = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_ArgsFormat = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_HelpText = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	case NETMSGTYPE_SV_COMMANDINFOREMOVE:
	{
		CNetMsg_Sv_CommandInfoRemove *pMsg = (CNetMsg_Sv_CommandInfoRemove *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Name = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	case NETMSGTYPE_CL_COMMAND:
	{
		CNetMsg_Cl_Command *pMsg = (CNetMsg_Cl_Command *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Name = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Arguments = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	default:
		m_pMsgFailedOn = "(type out of range)";
		break;
	}
	
	if(pUnpacker->Error())
		m_pMsgFailedOn = "(unpack error)";
	
	if(m_pMsgFailedOn || m_pObjFailedOn) {
		if(!m_pMsgFailedOn)
			m_pMsgFailedOn = "";
		if(!m_pObjFailedOn)
			m_pObjFailedOn = "";
		return 0;
	}
	m_pMsgFailedOn = "";
	m_pObjFailedOn = "";
	return m_aMsgData;
}